

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_as_json_code(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *__s;
  size_t sVar5;
  ushort **ppuVar6;
  char *unaff_RBX;
  char *unaff_R12;
  long lVar7;
  char *unaff_R14;
  char *unaff_R15;
  bson_t scope;
  bson_t code;
  undefined1 auStack_2c8 [12];
  undefined1 auStack_2bc [12];
  undefined8 uStack_2b0;
  undefined1 auStack_284 [12];
  undefined1 auStack_278 [8];
  undefined8 uStack_270;
  code *pcStack_268;
  undefined1 auStack_260 [8];
  undefined8 uStack_258;
  code *pcStack_250;
  undefined1 auStack_248 [8];
  undefined8 uStack_240;
  code *pcStack_238;
  undefined1 auStack_230 [8];
  undefined8 uStack_228;
  code *pcStack_220;
  undefined1 auStack_218 [8];
  char *pcStack_210;
  code *pcStack_208;
  char local_200 [128];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  
  pcVar4 = local_200;
  local_110 = 0;
  uStack_108 = 0;
  local_120 = 0;
  uStack_118 = 0;
  local_130 = 0;
  uStack_128 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_150 = 0;
  uStack_148 = 0;
  local_160 = 0;
  uStack_158 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_180 = 0x500000003;
  uStack_178 = 5;
  local_200[0x70] = '\0';
  local_200[0x71] = '\0';
  local_200[0x72] = '\0';
  local_200[0x73] = '\0';
  local_200[0x74] = '\0';
  local_200[0x75] = '\0';
  local_200[0x76] = '\0';
  local_200[0x77] = '\0';
  local_200[0x78] = '\0';
  local_200[0x79] = '\0';
  local_200[0x7a] = '\0';
  local_200[0x7b] = '\0';
  local_200[0x7c] = '\0';
  local_200[0x7d] = '\0';
  local_200[0x7e] = '\0';
  local_200[0x7f] = '\0';
  local_200[0x60] = '\0';
  local_200[0x61] = '\0';
  local_200[0x62] = '\0';
  local_200[99] = '\0';
  local_200[100] = '\0';
  local_200[0x65] = '\0';
  local_200[0x66] = '\0';
  local_200[0x67] = '\0';
  local_200[0x68] = '\0';
  local_200[0x69] = '\0';
  local_200[0x6a] = '\0';
  local_200[0x6b] = '\0';
  local_200[0x6c] = '\0';
  local_200[0x6d] = '\0';
  local_200[0x6e] = '\0';
  local_200[0x6f] = '\0';
  local_200[0x50] = '\0';
  local_200[0x51] = '\0';
  local_200[0x52] = '\0';
  local_200[0x53] = '\0';
  local_200[0x54] = '\0';
  local_200[0x55] = '\0';
  local_200[0x56] = '\0';
  local_200[0x57] = '\0';
  local_200[0x58] = '\0';
  local_200[0x59] = '\0';
  local_200[0x5a] = '\0';
  local_200[0x5b] = '\0';
  local_200[0x5c] = '\0';
  local_200[0x5d] = '\0';
  local_200[0x5e] = '\0';
  local_200[0x5f] = '\0';
  local_200[0x40] = '\0';
  local_200[0x41] = '\0';
  local_200[0x42] = '\0';
  local_200[0x43] = '\0';
  local_200[0x44] = '\0';
  local_200[0x45] = '\0';
  local_200[0x46] = '\0';
  local_200[0x47] = '\0';
  local_200[0x48] = '\0';
  local_200[0x49] = '\0';
  local_200[0x4a] = '\0';
  local_200[0x4b] = '\0';
  local_200[0x4c] = '\0';
  local_200[0x4d] = '\0';
  local_200[0x4e] = '\0';
  local_200[0x4f] = '\0';
  local_200[0x30] = '\0';
  local_200[0x31] = '\0';
  local_200[0x32] = '\0';
  local_200[0x33] = '\0';
  local_200[0x34] = '\0';
  local_200[0x35] = '\0';
  local_200[0x36] = '\0';
  local_200[0x37] = '\0';
  local_200[0x38] = '\0';
  local_200[0x39] = '\0';
  local_200[0x3a] = '\0';
  local_200[0x3b] = '\0';
  local_200[0x3c] = '\0';
  local_200[0x3d] = '\0';
  local_200[0x3e] = '\0';
  local_200[0x3f] = '\0';
  local_200[0x20] = '\0';
  local_200[0x21] = '\0';
  local_200[0x22] = '\0';
  local_200[0x23] = '\0';
  local_200[0x24] = '\0';
  local_200[0x25] = '\0';
  local_200[0x26] = '\0';
  local_200[0x27] = '\0';
  local_200[0x28] = '\0';
  local_200[0x29] = '\0';
  local_200[0x2a] = '\0';
  local_200[0x2b] = '\0';
  local_200[0x2c] = '\0';
  local_200[0x2d] = '\0';
  local_200[0x2e] = '\0';
  local_200[0x2f] = '\0';
  local_200[0x10] = '\0';
  local_200[0x11] = '\0';
  local_200[0x12] = '\0';
  local_200[0x13] = '\0';
  local_200[0x14] = '\0';
  local_200[0x15] = '\0';
  local_200[0x16] = '\0';
  local_200[0x17] = '\0';
  local_200[0x18] = '\0';
  local_200[0x19] = '\0';
  local_200[0x1a] = '\0';
  local_200[0x1b] = '\0';
  local_200[0x1c] = '\0';
  local_200[0x1d] = '\0';
  local_200[0x1e] = '\0';
  local_200[0x1f] = '\0';
  local_200[0] = '\x03';
  local_200[1] = '\0';
  local_200[2] = '\0';
  local_200[3] = '\0';
  local_200[4] = '\x05';
  local_200[5] = '\0';
  local_200[6] = '\0';
  local_200[7] = '\0';
  local_200[8] = '\x05';
  local_200[9] = '\0';
  local_200[10] = '\0';
  local_200[0xb] = '\0';
  local_200[0xc] = '\0';
  local_200[0xd] = '\0';
  local_200[0xe] = '\0';
  local_200[0xf] = '\0';
  pcStack_208 = (code *)0x12d2dc;
  cVar1 = bson_append_code(&local_180,"c",0xffffffff,"function () {}");
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x12d4ae;
    test_bson_as_json_code_cold_1();
LAB_0012d4ae:
    pcStack_208 = (code *)0x12d4b3;
    test_bson_as_json_code_cold_3();
LAB_0012d4b3:
    pcStack_208 = (code *)0x12d4b8;
    test_bson_as_json_code_cold_5();
LAB_0012d4b8:
    pcStack_208 = (code *)0x12d4bd;
    test_bson_as_json_code_cold_7();
LAB_0012d4bd:
    pcStack_208 = (code *)0x12d4c5;
    test_bson_as_json_code_cold_2();
LAB_0012d4c5:
    pcVar4 = unaff_R14;
    pcStack_208 = (code *)0x12d4cd;
    test_bson_as_json_code_cold_4();
LAB_0012d4cd:
    pcStack_208 = (code *)0x12d4d5;
    test_bson_as_json_code_cold_6();
  }
  else {
    pcStack_208 = (code *)0x12d2f3;
    unaff_RBX = (char *)bson_as_json(&local_180,0);
    if (unaff_RBX != "{ \"c\" : { \"$code\" : \"function () {}\" } }") {
      pcStack_208 = (code *)0x12d311;
      iVar2 = strcmp(unaff_RBX,"{ \"c\" : { \"$code\" : \"function () {}\" } }");
      if (iVar2 == 0) goto LAB_0012d319;
      goto LAB_0012d4bd;
    }
LAB_0012d319:
    pcStack_208 = (code *)0x12d321;
    bson_free(unaff_RBX);
    unaff_RBX = (char *)&local_180;
    pcStack_208 = (code *)0x12d331;
    bson_reinit(unaff_RBX);
    pcStack_208 = (code *)0x12d34f;
    cVar1 = bson_append_code_with_scope(unaff_RBX,"c",1,"function () {}",local_200);
    if (cVar1 == '\0') goto LAB_0012d4ae;
    pcStack_208 = (code *)0x12d366;
    unaff_RBX = (char *)bson_as_json(&local_180,0);
    if (unaff_RBX != "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }") {
      pcStack_208 = (code *)0x12d384;
      iVar2 = strcmp(unaff_RBX,"{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }");
      if (iVar2 == 0) goto LAB_0012d38c;
      goto LAB_0012d4c5;
    }
LAB_0012d38c:
    pcStack_208 = (code *)0x12d394;
    bson_free(unaff_RBX);
    unaff_RBX = (char *)&local_180;
    pcStack_208 = (code *)0x12d3a4;
    bson_reinit(unaff_RBX);
    pcStack_208 = (code *)0x12d3c0;
    bson_append_int32(local_200,"x",1,1);
    pcStack_208 = (code *)0x12d3de;
    cVar1 = bson_append_code_with_scope(unaff_RBX,"c",1,"function () {}",local_200);
    unaff_R14 = local_200;
    if (cVar1 == '\0') goto LAB_0012d4b3;
    pcStack_208 = (code *)0x12d3f5;
    unaff_RBX = (char *)bson_as_json(&local_180,0);
    if (unaff_RBX != "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { \"x\" : 1 } } }") {
      pcStack_208 = (code *)0x12d413;
      iVar2 = strcmp(unaff_RBX,
                     "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { \"x\" : 1 } } }");
      if (iVar2 == 0) goto LAB_0012d41b;
      goto LAB_0012d4cd;
    }
LAB_0012d41b:
    pcStack_208 = (code *)0x12d423;
    bson_free(unaff_RBX);
    unaff_RBX = (char *)&local_180;
    pcStack_208 = (code *)0x12d433;
    bson_reinit(unaff_RBX);
    pcStack_208 = (code *)0x12d44e;
    cVar1 = bson_append_code(unaff_RBX,"c",1,"return \"a\"");
    unaff_R14 = local_200;
    if (cVar1 == '\0') goto LAB_0012d4b8;
    pcStack_208 = (code *)0x12d461;
    unaff_RBX = (char *)bson_as_json(&local_180,0);
    if (unaff_RBX == "{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }") {
LAB_0012d483:
      pcStack_208 = (code *)0x12d48b;
      bson_free(unaff_RBX);
      pcStack_208 = (code *)0x12d498;
      bson_destroy(&local_180);
      pcStack_208 = (code *)0x12d4a0;
      bson_destroy(local_200);
      return;
    }
    pcStack_208 = (code *)0x12d47f;
    iVar2 = strcmp(unaff_RBX,"{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }");
    pcVar4 = local_200;
    if (iVar2 == 0) goto LAB_0012d483;
  }
  pcStack_208 = test_bson_as_json_date_time;
  test_bson_as_json_code_cold_8();
  pcStack_220 = (code *)0x12d4e6;
  pcStack_210 = unaff_RBX;
  pcStack_208 = (code *)pcVar4;
  uVar3 = bson_new();
  pcStack_220 = (code *)0x12d4ff;
  cVar1 = bson_append_date_time(uVar3,"epoch",0xffffffff,0);
  if (cVar1 == '\0') {
    pcStack_220 = (code *)0x12d58d;
    test_bson_as_json_date_time_cold_1();
LAB_0012d58d:
    pcStack_220 = (code *)0x12d592;
    test_bson_as_json_date_time_cold_2();
LAB_0012d592:
    pcStack_220 = (code *)0x12d597;
    test_bson_as_json_date_time_cold_3();
  }
  else {
    pcStack_220 = (code *)0x12d522;
    cVar1 = bson_append_date_time(uVar3,"negative",0xffffffff,0xfffffffff8a43600);
    if (cVar1 == '\0') goto LAB_0012d58d;
    pcStack_220 = (code *)0x12d53f;
    cVar1 = bson_append_date_time(uVar3,"positive",0xffffffff,0x75bca00);
    if (cVar1 == '\0') goto LAB_0012d592;
    pcStack_220 = (code *)0x12d54e;
    pcVar4 = (char *)bson_as_json(uVar3,auStack_218);
    if (pcVar4 == 
        "{ \"epoch\" : { \"$date\" : 0 }, \"negative\" : { \"$date\" : -123456000 }, \"positive\" : { \"$date\" : 123456000 } }"
       ) {
LAB_0012d570:
      pcStack_220 = (code *)0x12d578;
      bson_free(pcVar4);
      pcStack_220 = (code *)0x12d580;
      bson_destroy(uVar3);
      return;
    }
    pcStack_220 = (code *)0x12d56c;
    iVar2 = strcmp(pcVar4,
                   "{ \"epoch\" : { \"$date\" : 0 }, \"negative\" : { \"$date\" : -123456000 }, \"positive\" : { \"$date\" : 123456000 } }"
                  );
    if (iVar2 == 0) goto LAB_0012d570;
  }
  pcStack_220 = test_bson_as_json_regex;
  test_bson_as_json_date_time_cold_4();
  pcStack_238 = (code *)0x12d5a8;
  uStack_228 = uVar3;
  pcStack_220 = (code *)pcVar4;
  uVar3 = bson_new();
  pcStack_238 = (code *)0x12d5cd;
  cVar1 = bson_append_regex(uVar3,"regex",0xffffffff,"^abcd","xi");
  if (cVar1 == '\0') {
    pcStack_238 = (code *)0x12d6e9;
    test_bson_as_json_regex_cold_1();
LAB_0012d6e9:
    pcStack_238 = (code *)0x12d6ee;
    test_bson_as_json_regex_cold_2();
LAB_0012d6ee:
    pcStack_238 = (code *)0x12d6f3;
    test_bson_as_json_regex_cold_3();
LAB_0012d6f3:
    pcStack_238 = (code *)0x12d6f8;
    test_bson_as_json_regex_cold_4();
LAB_0012d6f8:
    pcStack_238 = (code *)0x12d6fd;
    test_bson_as_json_regex_cold_5();
LAB_0012d6fd:
    pcStack_238 = (code *)0x12d702;
    test_bson_as_json_regex_cold_6();
  }
  else {
    pcStack_238 = (code *)0x12d5f7;
    cVar1 = bson_append_regex(uVar3,"escaping",0xffffffff,"^\"","");
    if (cVar1 == '\0') goto LAB_0012d6e9;
    pcStack_238 = (code *)0x12d621;
    cVar1 = bson_append_regex(uVar3,"ordered",0xffffffff,"^abcd","ilmsux");
    if (cVar1 == '\0') goto LAB_0012d6ee;
    pcStack_238 = (code *)0x12d64b;
    cVar1 = bson_append_regex(uVar3,"unordered",0xffffffff,"^abcd","xusmli");
    if (cVar1 == '\0') goto LAB_0012d6f3;
    pcStack_238 = (code *)0x12d675;
    cVar1 = bson_append_regex(uVar3,"duplicate",0xffffffff,"^abcd","mmiii");
    if (cVar1 == '\0') goto LAB_0012d6f8;
    pcStack_238 = (code *)0x12d69b;
    cVar1 = bson_append_regex(uVar3,"unsupported",0xffffffff,"^abcd","jkmlvz");
    if (cVar1 == '\0') goto LAB_0012d6fd;
    pcStack_238 = (code *)0x12d6aa;
    pcVar4 = (char *)bson_as_json(uVar3,auStack_230);
    if (pcVar4 == 
        "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
       ) {
LAB_0012d6cc:
      pcStack_238 = (code *)0x12d6d4;
      bson_free(pcVar4);
      pcStack_238 = (code *)0x12d6dc;
      bson_destroy(uVar3);
      return;
    }
    pcStack_238 = (code *)0x12d6c8;
    iVar2 = strcmp(pcVar4,
                   "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
                  );
    if (iVar2 == 0) goto LAB_0012d6cc;
  }
  pcStack_238 = test_bson_as_json_symbol;
  test_bson_as_json_regex_cold_7();
  pcStack_250 = (code *)0x12d713;
  uStack_240 = uVar3;
  pcStack_238 = (code *)pcVar4;
  uVar3 = bson_new();
  pcStack_250 = (code *)0x12d737;
  cVar1 = bson_append_symbol(uVar3,"symbol",0xffffffff,"foo",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_250 = (code *)0x12d7aa;
    test_bson_as_json_symbol_cold_1();
LAB_0012d7aa:
    pcStack_250 = (code *)0x12d7af;
    test_bson_as_json_symbol_cold_2();
  }
  else {
    pcStack_250 = (code *)0x12d75c;
    cVar1 = bson_append_symbol(uVar3,"escaping",0xffffffff,"\"bar\"",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d7aa;
    pcStack_250 = (code *)0x12d76b;
    pcVar4 = (char *)bson_as_json(uVar3,auStack_248);
    if (pcVar4 == "{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }") {
LAB_0012d78d:
      pcStack_250 = (code *)0x12d795;
      bson_free(pcVar4);
      pcStack_250 = (code *)0x12d79d;
      bson_destroy(uVar3);
      return;
    }
    pcStack_250 = (code *)0x12d789;
    iVar2 = strcmp(pcVar4,"{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }");
    if (iVar2 == 0) goto LAB_0012d78d;
  }
  pcStack_250 = test_bson_as_json_utf8;
  test_bson_as_json_symbol_cold_3();
  pcStack_268 = (code *)0x12d7c0;
  uStack_258 = uVar3;
  pcStack_250 = (code *)pcVar4;
  uVar3 = bson_new();
  pcStack_268 = (code *)0x12d7e0;
  cVar1 = bson_append_utf8(uVar3,anon_var_dwarf_48e4,0xffffffff,anon_var_dwarf_48e4,0xffffffff);
  if (cVar1 == '\0') {
    pcStack_268 = (code *)0x12d822;
    test_bson_as_json_utf8_cold_1();
  }
  else {
    pcStack_268 = (code *)0x12d7ef;
    pcVar4 = (char *)bson_as_json(uVar3,auStack_260);
    pcStack_268 = (code *)0x12d801;
    iVar2 = strcmp(pcVar4,anon_var_dwarf_19b14);
    if (iVar2 == 0) {
      pcStack_268 = (code *)0x12d80d;
      bson_free(pcVar4);
      pcStack_268 = (code *)0x12d815;
      bson_destroy(uVar3);
      return;
    }
  }
  pcStack_268 = test_bson_as_json_dbpointer;
  test_bson_as_json_utf8_cold_2();
  uStack_270 = uVar3;
  pcStack_268 = (code *)pcVar4;
  bson_oid_init_from_string(auStack_284,"12341234123412abcdababcd");
  uVar3 = bson_new();
  cVar1 = bson_append_dbpointer(uVar3,"dbpointer",0xffffffff,"collection",auStack_284);
  if (cVar1 == '\0') {
    test_bson_as_json_dbpointer_cold_1();
  }
  else {
    cVar1 = bson_append_dbpointer(uVar3,"escaping",0xffffffff,"\"coll\"",auStack_284);
    if (cVar1 != '\0') {
      pcVar4 = (char *)bson_as_json(uVar3,auStack_278);
      if (pcVar4 == 
          "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
         ) {
LAB_0012d8bf:
        bson_free(pcVar4);
        bson_destroy(uVar3);
        return;
      }
      iVar2 = strcmp(pcVar4,
                     "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
                    );
      if (iVar2 == 0) goto LAB_0012d8bf;
      goto LAB_0012d8e1;
    }
  }
  test_bson_as_json_dbpointer_cold_2();
LAB_0012d8e1:
  test_bson_as_json_dbpointer_cold_3();
  uStack_2b0 = uVar3;
  bson_oid_init_from_string(auStack_2bc,"12341234123412abcdababcd");
  uVar3 = bson_new();
  cVar1 = bson_append_dbpointer(uVar3,"p",1,"coll",auStack_2bc);
  if (cVar1 == '\0') {
    test_bson_as_canonical_extended_json_dbpointer_cold_1();
  }
  else {
    __s = (char *)bson_as_canonical_extended_json(uVar3,auStack_2c8);
    sVar5 = strlen(__s);
    unaff_R15 = (char *)bson_malloc0(sVar5 + 1);
    unaff_R12 = (char *)bson_malloc0(0x62);
    lVar7 = 0;
    ppuVar6 = __ctype_b_loc();
    pcVar4 = __s;
    do {
      do {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      unaff_R15[lVar7] = cVar1;
      lVar7 = lVar7 + 1;
    } while (*pcVar4 != '\0');
    pcVar4 = 
    "{ \"p\" : { \"$dbPointer\" : { \"$ref\" : \"coll\", \"$id\" : { \"$oid\" : \"12341234123412abcdababcd\" } } } }"
    ;
    lVar7 = 0;
    do {
      do {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      unaff_R12[lVar7] = cVar1;
      lVar7 = lVar7 + 1;
    } while (*pcVar4 != '\0');
    iVar2 = strcmp(unaff_R15,unaff_R12);
    if (iVar2 == 0) {
      bson_free(unaff_R15);
      bson_free(unaff_R12);
      bson_free(__s);
      bson_destroy(uVar3);
      return;
    }
  }
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n%s:%d  %s()\n",unaff_R15,unaff_R12,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x284,"test_bson_as_canonical_extended_json_dbpointer");
  abort();
}

Assistant:

static void
test_bson_as_json_code (void)
{
   bson_t code = BSON_INITIALIZER;
   bson_t scope = BSON_INITIALIZER;
   char *str;

   BSON_ASSERT (bson_append_code (&code, "c", -1, "function () {}"));
   str = bson_as_json (&code, NULL);
   ASSERT_CMPSTR (str, "{ \"c\" : { \"$code\" : \"function () {}\" } }");

   bson_free (str);
   bson_reinit (&code);

   /* empty scope */
   BSON_ASSERT (
      BSON_APPEND_CODE_WITH_SCOPE (&code, "c", "function () {}", &scope));
   str = bson_as_json (&code, NULL);
   ASSERT_CMPSTR (
      str, "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }");

   bson_free (str);
   bson_reinit (&code);

   BSON_APPEND_INT32 (&scope, "x", 1);
   BSON_ASSERT (
      BSON_APPEND_CODE_WITH_SCOPE (&code, "c", "function () {}", &scope));
   str = bson_as_json (&code, NULL);
   ASSERT_CMPSTR (str,
                  "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" "
                  ": { \"x\" : 1 } } }");

   bson_free (str);
   bson_reinit (&code);

   /* test that embedded quotes are backslash-escaped */
   BSON_ASSERT (BSON_APPEND_CODE (&code, "c", "return \"a\""));
   str = bson_as_json (&code, NULL);

   /* hard to read, this is { "c" : { "$code" : "return \"a\"" } } */
   ASSERT_CMPSTR (str, "{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }");

   bson_free (str);
   bson_destroy (&code);
   bson_destroy (&scope);
}